

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

void yaml_document_delete(yaml_document_t *document)

{
  yaml_node_type_t yVar1;
  yaml_node_t *__ptr;
  yaml_node_t *pyVar2;
  yaml_char_t *__ptr_00;
  yaml_tag_directive_t *pyVar3;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x467,"void yaml_document_delete(yaml_document_t *)");
  }
  while( true ) {
    __ptr = (document->nodes).start;
    pyVar2 = (document->nodes).top;
    if (__ptr == pyVar2) {
      if (__ptr != (yaml_node_t *)0x0) {
        free(__ptr);
      }
      (document->nodes).start = (yaml_node_t *)0x0;
      (document->nodes).end = (yaml_node_t *)0x0;
      (document->nodes).top = (yaml_node_t *)0x0;
      if (document->version_directive != (yaml_version_directive_t *)0x0) {
        free(document->version_directive);
      }
      for (pyVar3 = (document->tag_directives).start; pyVar3 != (document->tag_directives).end;
          pyVar3 = pyVar3 + 1) {
        if (pyVar3->handle != (yaml_char_t *)0x0) {
          free(pyVar3->handle);
        }
        if (pyVar3->prefix != (yaml_char_t *)0x0) {
          free(pyVar3->prefix);
        }
      }
      pyVar3 = (document->tag_directives).start;
      if (pyVar3 != (yaml_tag_directive_t *)0x0) {
        free(pyVar3);
      }
      (document->end_mark).index = 0;
      (document->end_mark).line = 0;
      (document->start_mark).line = 0;
      (document->start_mark).column = 0;
      document->start_implicit = 0;
      document->end_implicit = 0;
      (document->start_mark).index = 0;
      (document->tag_directives).start = (yaml_tag_directive_t *)0x0;
      (document->tag_directives).end = (yaml_tag_directive_t *)0x0;
      (document->nodes).top = (yaml_node_t *)0x0;
      document->version_directive = (yaml_version_directive_t *)0x0;
      (document->nodes).start = (yaml_node_t *)0x0;
      (document->nodes).end = (yaml_node_t *)0x0;
      (document->end_mark).column = 0;
      return;
    }
    (document->nodes).top = pyVar2 + -1;
    yVar1 = pyVar2[-1].type;
    __ptr_00 = pyVar2[-1].data.scalar.value;
    if (pyVar2[-1].tag != (yaml_char_t *)0x0) {
      free(pyVar2[-1].tag);
    }
    if (((yVar1 != YAML_MAPPING_NODE) && (yVar1 != YAML_SEQUENCE_NODE)) &&
       (yVar1 != YAML_SCALAR_NODE)) break;
    if (__ptr_00 != (yaml_char_t *)0x0) {
      free(__ptr_00);
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                ,0x477,"void yaml_document_delete(yaml_document_t *)");
}

Assistant:

YAML_DECLARE(void)
yaml_document_delete(yaml_document_t *document)
{
    yaml_tag_directive_t *tag_directive;

    assert(document);   /* Non-NULL document object is expected. */

    while (!STACK_EMPTY(&context, document->nodes)) {
        yaml_node_t node = POP(&context, document->nodes);
        yaml_free(node.tag);
        switch (node.type) {
            case YAML_SCALAR_NODE:
                yaml_free(node.data.scalar.value);
                break;
            case YAML_SEQUENCE_NODE:
                STACK_DEL(&context, node.data.sequence.items);
                break;
            case YAML_MAPPING_NODE:
                STACK_DEL(&context, node.data.mapping.pairs);
                break;
            default:
                assert(0);  /* Should not happen. */
        }
    }
    STACK_DEL(&context, document->nodes);

    yaml_free(document->version_directive);
    for (tag_directive = document->tag_directives.start;
            tag_directive != document->tag_directives.end;
            tag_directive++) {
        yaml_free(tag_directive->handle);
        yaml_free(tag_directive->prefix);
    }
    yaml_free(document->tag_directives.start);

    memset(document, 0, sizeof(yaml_document_t));
}